

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginComboPreview(void)

{
  ImRect *r;
  ImGuiComboPreviewData *r_00;
  float *pfVar1;
  float fVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImGuiWindow *pIVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  ImVec2 IVar8;
  
  pIVar6 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  if (pIVar5->SkipItems == false) {
    r = &(GImGui->LastItemData).Rect;
    bVar7 = ImRect::Overlaps(&pIVar5->ClipRect,r);
    if (bVar7) {
      r_00 = &pIVar6->ComboPreviewData;
      fVar2 = (r->Min).x;
      if ((((fVar2 != (r_00->PreviewRect).Min.x) || (NAN(fVar2) || NAN((r_00->PreviewRect).Min.x)))
          || (fVar2 = (pIVar6->LastItemData).Rect.Min.y,
             pfVar1 = &(pIVar6->ComboPreviewData).PreviewRect.Min.y, fVar2 != *pfVar1)) ||
         (NAN(fVar2) || NAN(*pfVar1))) {
        __assert_fail("g.LastItemData.Rect.Min.x == preview_data->PreviewRect.Min.x && g.LastItemData.Rect.Min.y == preview_data->PreviewRect.Min.y"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_widgets.cpp"
                      ,0x6c2,"bool ImGui::BeginComboPreview()");
      }
      bVar7 = ImRect::Contains(&pIVar5->ClipRect,&r_00->PreviewRect);
      if (bVar7) {
        (pIVar6->ComboPreviewData).BackupCursorPos = (pIVar5->DC).CursorPos;
        (pIVar6->ComboPreviewData).BackupCursorMaxPos = (pIVar5->DC).CursorMaxPos;
        (pIVar6->ComboPreviewData).BackupCursorPosPrevLine = (pIVar5->DC).CursorPosPrevLine;
        (pIVar6->ComboPreviewData).BackupPrevLineTextBaseOffset =
             (pIVar5->DC).PrevLineTextBaseOffset;
        (pIVar6->ComboPreviewData).BackupLayout = (pIVar5->DC).LayoutType;
        IVar3 = (pIVar6->ComboPreviewData).PreviewRect.Min;
        IVar4 = (pIVar6->Style).FramePadding;
        IVar8.x = IVar4.x + IVar3.x;
        IVar8.y = IVar4.y + IVar3.y;
        (pIVar5->DC).CursorPos = IVar8;
        (pIVar5->DC).CursorMaxPos = IVar8;
        (pIVar5->DC).LayoutType = 0;
        (pIVar5->DC).IsSameLine = false;
        PushClipRect((ImVec2 *)r_00,&(pIVar6->ComboPreviewData).PreviewRect.Max,true);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ImGui::BeginComboPreview()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiComboPreviewData* preview_data = &g.ComboPreviewData;

    if (window->SkipItems || !window->ClipRect.Overlaps(g.LastItemData.Rect)) // FIXME: Because we don't have a ImGuiItemStatusFlags_Visible flag to test last ItemAdd() result
        return false;
    IM_ASSERT(g.LastItemData.Rect.Min.x == preview_data->PreviewRect.Min.x && g.LastItemData.Rect.Min.y == preview_data->PreviewRect.Min.y); // Didn't call after BeginCombo/EndCombo block or forgot to pass ImGuiComboFlags_CustomPreview flag?
    if (!window->ClipRect.Contains(preview_data->PreviewRect)) // Narrower test (optional)
        return false;

    // FIXME: This could be contained in a PushWorkRect() api
    preview_data->BackupCursorPos = window->DC.CursorPos;
    preview_data->BackupCursorMaxPos = window->DC.CursorMaxPos;
    preview_data->BackupCursorPosPrevLine = window->DC.CursorPosPrevLine;
    preview_data->BackupPrevLineTextBaseOffset = window->DC.PrevLineTextBaseOffset;
    preview_data->BackupLayout = window->DC.LayoutType;
    window->DC.CursorPos = preview_data->PreviewRect.Min + g.Style.FramePadding;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.LayoutType = ImGuiLayoutType_Horizontal;
    window->DC.IsSameLine = false;
    PushClipRect(preview_data->PreviewRect.Min, preview_data->PreviewRect.Max, true);

    return true;
}